

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascr.c
# Opt level: O0

void ascr_shift_one_cache_frame(ascr_t *a,int32 win_efv)

{
  int local_1c;
  int local_18;
  int32 j;
  int32 i;
  int32 win_efv_local;
  ascr_t *a_local;
  
  for (local_18 = 0; local_18 < win_efv + -1; local_18 = local_18 + 1) {
    a->cache_best_list[local_18] = a->cache_best_list[local_18 + 1];
    for (local_1c = 0; local_1c < a->n_cisen; local_1c = local_1c + 1) {
      a->cache_ci_senscr[local_18][local_1c] = a->cache_ci_senscr[local_18 + 1][local_1c];
    }
  }
  return;
}

Assistant:

void
ascr_shift_one_cache_frame(ascr_t * a, int32 win_efv)
{
    int32 i, j;
    for (i = 0; i < win_efv - 1; i++) {
        a->cache_best_list[i] = a->cache_best_list[i + 1];
        for (j = 0; j < a->n_cisen; j++) {
            a->cache_ci_senscr[i][j] = a->cache_ci_senscr[i + 1][j];
        }
    }
}